

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_set_options.c
# Opt level: O0

int archive_set_format_option(archive *_a,char *m,char *o,char *v)

{
  int iVar1;
  archive_write *a;
  char *v_local;
  char *o_local;
  char *m_local;
  archive *_a_local;
  
  if (_a[1].read_data_output_offset == 0) {
    _a_local._4_4_ = -0x15;
    if (m == (char *)0x0) {
      _a_local._4_4_ = -0x19;
    }
  }
  else if ((m == (char *)0x0) ||
          (iVar1 = strcmp(m,(char *)_a[1].read_data_output_offset), iVar1 == 0)) {
    if (*(long *)&_a[1].read_data_is_posix_read == 0) {
      _a_local._4_4_ = -0x14;
    }
    else {
      _a_local._4_4_ = (**(code **)&_a[1].read_data_is_posix_read)(_a,o,v);
    }
  }
  else {
    _a_local._4_4_ = -0x15;
  }
  return _a_local._4_4_;
}

Assistant:

static int
archive_set_format_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	struct archive_read *a = (struct archive_read *)_a;
	size_t i;
	int r, rv = ARCHIVE_WARN, matched_modules = 0;

	for (i = 0; i < sizeof(a->formats)/sizeof(a->formats[0]); i++) {
		struct archive_format_descriptor *format = &a->formats[i];

		if (format->options == NULL || format->name == NULL)
			/* This format does not support option. */
			continue;
		if (m != NULL) {
			if (strcmp(format->name, m) != 0)
				continue;
			++matched_modules;
		}

		a->format = format;
		r = format->options(a, o, v);
		a->format = NULL;

		if (r == ARCHIVE_FATAL)
			return (ARCHIVE_FATAL);

		if (r == ARCHIVE_OK)
			rv = ARCHIVE_OK;
	}
	/* If the format name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (m != NULL && matched_modules == 0)
		return ARCHIVE_WARN - 1;
	return (rv);
}